

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int generate_by_wrapper_a(uchar *script,size_t script_len,size_t *write_len)

{
  size_t __n;
  size_t used_len;
  size_t *write_len_local;
  size_t script_len_local;
  uchar *script_local;
  
  __n = *write_len;
  if (((__n == 0) || (script_len < __n + 2)) || (10000 < __n + 2)) {
    script_local._4_4_ = -2;
  }
  else {
    memmove(script + 1,script,__n);
    *script = 'k';
    script[__n + 1] = 'l';
    *write_len = __n + 2;
    script_local._4_4_ = 0;
  }
  return script_local._4_4_;
}

Assistant:

static int generate_by_wrapper_a(
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    size_t used_len = *write_len;
    if (!used_len || (used_len + 2 > script_len) || (used_len + 2 > DESCRIPTOR_WITNESS_SCRIPT_MAX_SIZE))
        return WALLY_EINVAL;

    memmove(script + 1, script, used_len);
    script[0] = OP_TOALTSTACK;
    script[used_len + 1] = OP_FROMALTSTACK;
    *write_len = used_len + 2;
    return WALLY_OK;
}